

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_pubkey_ok_ecdsa_signed.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  LIBSSH2_SESSION *session_local;
  
  iVar1 = test_auth_pubkey(session,0,"libssh2",(char *)0x0,"key_ecdsa_signed-cert.pub",
                           "key_ecdsa_signed");
  return iVar1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
#if LIBSSH2_ECDSA && \
    (defined(LIBSSH2_OPENSSL) || defined(LIBSSH2_WOLFSSL))
    /* set in Dockerfile */
    return test_auth_pubkey(session, 0,
                            "libssh2",
                            NULL,
                            "key_ecdsa_signed-cert.pub",
                            "key_ecdsa_signed");
#else
    (void)session;
    return 0;
#endif
}